

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

int64_t rcg::getInteger(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,int64_t *vmin,
                       int64_t *vmax,bool exception,bool igncache)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  long *plVar4;
  int64_t iVar5;
  invalid_argument *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int64_t *in_RCX;
  int64_t *in_RDX;
  char *in_RSI;
  byte in_R8B;
  byte in_R9B;
  GenericException *ex;
  IInteger *val;
  IEnumeration *p;
  INode *node;
  int64_t ret;
  IBase *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  long *local_200;
  long *local_1e0;
  allocator local_179;
  string local_178 [32];
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  string local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  long *local_a8;
  long *local_a0;
  gcstring local_88 [80];
  long *local_38;
  int64_t local_30;
  byte local_22;
  byte local_21;
  int64_t *local_20;
  int64_t *local_18;
  char *local_10;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_30 = 0;
  if (in_RDX != (int64_t *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (int64_t *)0x0) {
    *in_RCX = 0;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar3 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1328a5);
  GenICam_3_4::gcstring::gcstring(local_88,local_10);
  iVar2 = (*(peVar3->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar3,local_88);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_88);
  local_38 = plVar4;
  if (plVar4 == (long *)0x0) {
    if ((local_21 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"Feature not found: ",&local_179);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffdb0);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_158);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsReadable(in_stack_fffffffffffffdb0);
    if (bVar1) {
      iVar2 = (**(code **)(*local_38 + 0xf0))();
      if (iVar2 == 9) {
        if (local_38 == (long *)0x0) {
          local_1e0 = (long *)0x0;
        }
        else {
          local_1e0 = (long *)__dynamic_cast(local_38,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe)
          ;
        }
        local_a0 = local_1e0;
        plVar4 = (long *)(**(code **)(*local_1e0 + 0x78))(local_1e0,0,local_22 & 1);
        local_30 = (**(code **)(*plVar4 + 0x38))();
        if (local_18 != (int64_t *)0x0) {
          *local_18 = local_30;
        }
        if (local_20 != (int64_t *)0x0) {
          *local_20 = local_30;
        }
      }
      else {
        if (local_38 == (long *)0x0) {
          local_200 = (long *)0x0;
        }
        else {
          local_200 = (long *)__dynamic_cast(local_38,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
        }
        local_a8 = local_200;
        if (local_200 == (long *)0x0) {
          if ((local_21 & 1) != 0) {
            local_ea = 1;
            piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e8,"Feature not integer: ",&local_e9);
            std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
            std::invalid_argument::invalid_argument(piVar6,local_c8);
            local_ea = 0;
            __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        else {
          local_30 = (**(code **)(*local_200 + 0x48))(local_200,0,local_22 & 1);
          if (local_18 != (int64_t *)0x0) {
            iVar5 = (**(code **)(*local_a8 + 0x60))();
            *local_18 = iVar5;
          }
          if (local_20 != (int64_t *)0x0) {
            iVar5 = (**(code **)(*local_a8 + 0x68))();
            *local_20 = iVar5;
          }
        }
      }
    }
    else if ((local_21 & 1) != 0) {
      local_132 = 1;
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"Feature not readable: ",&local_131);
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::invalid_argument::invalid_argument(piVar6,local_110);
      local_132 = 0;
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return local_30;
}

Assistant:

int64_t getInteger(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                   int64_t *vmin, int64_t *vmax, bool exception, bool igncache)
{
  int64_t ret=0;

  if (vmin != 0) *vmin=0;
  if (vmax != 0) *vmax=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        if (node->GetPrincipalInterfaceType() == GenApi::intfIEnumeration)
        {
          GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
          ret=p->GetCurrentEntry(false, igncache)->GetValue();

          if (vmin != 0) *vmin=ret;
          if (vmax != 0) *vmax=ret;
        }
        else
        {
          GenApi::IInteger *val=dynamic_cast<GenApi::IInteger *>(node);

          if (val != 0)
          {
            ret=val->GetValue(false, igncache);

            if (vmin != 0) *vmin=val->GetMin();
            if (vmax != 0) *vmax=val->GetMax();
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Feature not integer: ")+name);
          }
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}